

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::finalise_model(Proof *this)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  __uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  _Var2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  ostream *poVar6;
  ProofError *pPVar7;
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  ostreambuf_iterator<char,_std::char_traits<char>_> __result_00;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __first_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::make_unique<std::ofstream,std::__cxx11::string&>(&local_60);
  _Var4._M_p = local_60._M_dataplus._M_p;
  poVar6 = std::operator<<((ostream *)local_60._M_dataplus._M_p,"* #variable= ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," #constraint= ");
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::operator<<(poVar6,'\n');
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  __result._M_failed = *(long *)(_Var4._M_p + *(long *)(*(long *)_Var4._M_p + -0x18) + 0xe8) == 0;
  __result._M_sbuf =
       (streambuf_type *)*(long *)(_Var4._M_p + *(long *)(*(long *)_Var4._M_p + -0x18) + 0xe8);
  __result._9_7_ = 0;
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf =
       *(streambuf_type **)
        ((long)&(_Var1._M_head_impl)->field_0x2b0 +
        *(long *)(*(long *)&(_Var1._M_head_impl)->model_prelude_stream + -0x18));
  std::copy<char>(__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                          (ZEXT816(0xffffffffffffffff) << 0x40),__result);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::ios::clear((int)_Var1._M_head_impl + 0x1c8 +
                  (int)*(undefined8 *)(*(long *)&(_Var1._M_head_impl)->model_prelude_stream + -0x18)
                 );
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  __result_00._M_failed = *(long *)(_Var4._M_p + *(long *)(*(long *)_Var4._M_p + -0x18) + 0xe8) == 0
  ;
  __result_00._M_sbuf =
       (streambuf_type *)*(long *)(_Var4._M_p + *(long *)(*(long *)_Var4._M_p + -0x18) + 0xe8);
  __result_00._9_7_ = 0;
  __first_00._8_8_ = 0xffffffff;
  __first_00._M_sbuf =
       *(streambuf_type **)
        ((long)&(_Var1._M_head_impl)->field_0x128 +
        *(long *)(*(long *)&(_Var1._M_head_impl)->model_stream + -0x18));
  std::copy<char>(__first_00,
                  (istreambuf_iterator<char,_std::char_traits<char>_>)
                  (ZEXT816(0xffffffffffffffff) << 0x40),__result_00);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::ios::clear((int)_Var1._M_head_impl + 0x40 +
                  (int)*(undefined8 *)(*(long *)&(_Var1._M_head_impl)->model_stream + -0x18));
  if (((byte)*(ostream *)(_Var4._M_p + *(long *)(*(long *)_Var4._M_p + -0x18) + 0x20) & 5) != 0) {
    pPVar7 = (ProofError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_40,"Error writing opb file to \'",
                   &((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    opb_filename);
    std::operator+(&local_60,&local_40,"\'");
    ProofError::ProofError(pPVar7,&local_60);
    __cxa_throw(pPVar7,&ProofError::typeinfo,ProofError::~ProofError);
  }
  std::make_unique<std::ofstream,std::__cxx11::string&>(&local_60);
  _Var5._M_p = local_60._M_dataplus._M_p;
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_60._M_dataplus._M_p = (pointer)0x0;
  _Var2._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       *(tuple<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
         *)&((_Var1._M_head_impl)->proof_stream)._M_t;
  ((_Var1._M_head_impl)->proof_stream)._M_t =
       (__uniq_ptr_data<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>,_true,_true>
        )_Var5._M_p;
  if ((__uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl + 8))();
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"pseudo-Boolean proof version 2.0\n");
  poVar6 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"f ");
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::operator<<(poVar6," 0\n");
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->proof_line =
       (_Var1._M_head_impl)->proof_line + (_Var1._M_head_impl)->nb_constraints;
  uVar3._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var1._M_head_impl)->proof_stream)._M_t;
  if ((*(byte *)((long)uVar3._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl +
                *(long *)(*(long *)uVar3._M_t.
                                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                   ._M_head_impl + -0x18) + 0x20) & 5) == 0) {
    (**(code **)(*(long *)_Var4._M_p + 8))(_Var4._M_p);
    return;
  }
  pPVar7 = (ProofError *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Error writing proof file to \'",
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  log_filename);
  std::operator+(&local_60,&local_40,"\'");
  ProofError::ProofError(pPVar7,&local_60);
  __cxa_throw(pPVar7,&ProofError::typeinfo,ProofError::~ProofError);
}

Assistant:

auto Proof::finalise_model() -> void
{
    unique_ptr<ostream> f = make_unique<ofstream>(_imp->opb_filename);

    *f << "* #variable= " << (_imp->variable_mappings.size() + _imp->binary_variable_mappings.size() + _imp->connected_variable_mappings.size() + _imp->connected_variable_mappings_aux.size())
       << " #constraint= " << _imp->nb_constraints << '\n';
    copy(istreambuf_iterator<char>{_imp->model_prelude_stream}, istreambuf_iterator<char>{}, ostreambuf_iterator<char>{*f});
    _imp->model_prelude_stream.clear();
    copy(istreambuf_iterator<char>{_imp->model_stream}, istreambuf_iterator<char>{}, ostreambuf_iterator<char>{*f});
    _imp->model_stream.clear();

    if (! *f)
        throw ProofError{"Error writing opb file to '" + _imp->opb_filename + "'"};

    _imp->proof_stream = make_unique<ofstream>(_imp->log_filename);

    *_imp->proof_stream << "pseudo-Boolean proof version 2.0\n";

    *_imp->proof_stream << "f " << _imp->nb_constraints << " 0\n";
    _imp->proof_line += _imp->nb_constraints;

    if (! *_imp->proof_stream)
        throw ProofError{"Error writing proof file to '" + _imp->log_filename + "'"};
}